

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_1;
  SimpleAssignmentPatternSyntax *pSVar1;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0x28),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pSVar1 = BumpAllocator::
           emplace<slang::syntax::SimpleAssignmentPatternSyntax,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_30,args_1,&local_40);
  return (int)pSVar1;
}

Assistant:

static SyntaxNode* clone(const SimpleAssignmentPatternSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SimpleAssignmentPatternSyntax>(
        node.openBrace.deepClone(alloc),
        *deepClone(node.items, alloc),
        node.closeBrace.deepClone(alloc)
    );
}